

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

unsigned_long cmsys::Directory::GetNumberOfFilesInDirectory(string *name)

{
  char *__name;
  DIR *__dirp;
  dirent *local_30;
  dirent *d;
  unsigned_long count;
  DIR *dir;
  string *name_local;
  
  __name = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(__name);
  if (__dirp == (DIR *)0x0) {
    name_local = (string *)0x0;
  }
  else {
    d = (dirent *)0x0;
    local_30 = readdir(__dirp);
    while (local_30 != (dirent *)0x0) {
      d = (dirent *)((long)&d->d_ino + 1);
      local_30 = readdir(__dirp);
    }
    closedir(__dirp);
    name_local = (string *)d;
  }
  return (unsigned_long)name_local;
}

Assistant:

unsigned long Directory::GetNumberOfFilesInDirectory(const std::string& name)
{
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    return 0;
  }

  unsigned long count = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    count++;
  }
  closedir(dir);
  return count;
}